

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy_toplex_map.h
# Opt level: O1

bool __thiscall
Gudhi::Lazy_toplex_map::insert_simplex<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (Lazy_toplex_map *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range
          )

{
  _Rb_tree_node_base *__k;
  unordered_map<unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *this_00;
  handle_type handle;
  size_type sVar1;
  size_type sVar2;
  _Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pair<std::__detail::_Node_iterator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true,_true>,_bool>
  pVar11;
  Simplex_ptr sptr;
  handle_type v_handle;
  Simplex sigma;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a8;
  _Rb_tree_node_base *local_70;
  marked_heap_node<std::pair<unsigned_long,_unsigned_long>_> *local_68;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  set<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)&local_60,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(vertex_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(vertex_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish);
  this->empty_toplex = local_60._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_b8 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::allocator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>&>
            (&local_b0,&local_b8,
             (allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
              *)&local_a8,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &local_60);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_60._M_impl.super__Rb_tree_header) {
    uVar8 = 0;
  }
  else {
    this_00 = &this->t0;
    do {
      __k = local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1;
      local_70 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      sVar2 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&this_00->_M_h,(key_type *)__k);
      if (sVar2 == 0) {
        local_a8._M_buckets = &local_a8._M_single_bucket;
        local_a8._M_bucket_count = 1;
        local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_a8._M_element_count = 0;
        local_a8._M_rehash_policy._M_max_load_factor = 1.0;
        local_a8._M_rehash_policy._4_4_ = 0;
        local_a8._M_rehash_policy._M_next_resize = 0;
        local_a8._M_single_bucket = (__node_base_ptr)0x0;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<unsigned_long_const&,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)this_00,__k,&local_a8);
        std::
        _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_a8);
        local_a8._M_bucket_count = *(size_type *)__k;
        local_a8._M_buckets = (__buckets_ptr)0x0;
        local_68 = (marked_heap_node<std::pair<unsigned_long,_unsigned_long>_> *)
                   boost::heap::
                   fibonacci_heap<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                   ::push(&this->cleaning_priority,(value_type *)&local_a8);
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>>,std::allocator<std::pair<unsigned_long_const,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<unsigned_long_const&,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>&>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>>,std::allocator<std::pair<unsigned_long_const,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->cp_handles,__k,&local_68);
      }
      p_Var3 = (_Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)this_00,(key_type *)__k);
      pVar11 = std::
               _Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_emplace<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>&>
                         (p_Var3,&local_b8);
      uVar8 = pVar11._8_4_;
      pmVar4 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>,_std::allocator<std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>,_std::allocator<std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->cp_handles,(key_type *)__k);
      handle.node_ = pmVar4->node_;
      pmVar5 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this_00,(key_type *)__k);
      sVar1 = (pmVar5->_M_h)._M_element_count;
      sVar6 = get_gamma0_lbound(this,*(Vertex *)__k);
      local_a8._M_buckets = (__buckets_ptr)(sVar1 - sVar6);
      local_a8._M_bucket_count = *(size_type *)__k;
      boost::heap::
      fibonacci_heap<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
      ::update(&this->cleaning_priority,handle,(const_reference)&local_a8);
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)std::_Rb_tree_increment(local_70);
    } while ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_60._M_impl.super__Rb_tree_header);
  }
  if ((uVar8 & 1) != 0) {
    this->size = this->size + 1;
  }
  sVar6 = this->size;
  auVar9._8_4_ = (int)(sVar6 >> 0x20);
  auVar9._0_8_ = sVar6;
  auVar9._12_4_ = 0x45300000;
  lVar7 = this->size_lbound + 1;
  auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar10._0_8_ = lVar7;
  auVar10._12_4_ = 0x45300000;
  if (((auVar10._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * this->BETTA <
      (auVar9._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) {
    if ((this->cleaning_priority).super_type.super_base_type.super_size_holder<true,_unsigned_long>.
        size_ == 0) {
      __assert_fail("!empty()","/usr/include/boost/heap/fibonacci_heap.hpp",0x14f,
                    "const value_type &boost::heap::fibonacci_heap<std::pair<unsigned long, unsigned long>>::top() const [T = std::pair<unsigned long, unsigned long>, A0 = boost::parameter::void_, A1 = boost::parameter::void_, A2 = boost::parameter::void_, A3 = boost::parameter::void_, A4 = boost::parameter::void_]"
                   );
    }
    clean(this,(((this->cleaning_priority).top_element)->
               super_parent_pointing_heap_node<std::pair<unsigned_long,_unsigned_long>_>).
               super_heap_node<std::pair<unsigned_long,_unsigned_long>,_true>.value.second);
  }
  if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_60);
  return (bool)((byte)uVar8 & 1);
}

Assistant:

bool Lazy_toplex_map::insert_simplex(const Input_vertex_range &vertex_range) {
  Simplex sigma(vertex_range.begin(), vertex_range.end());
  // Check empty face management
  empty_toplex = (sigma.size() == 0);
  Simplex_ptr sptr = std::make_shared<Simplex>(sigma);
  bool inserted = false;
  for (const Vertex &v : sigma) {
    if (!t0.count(v)) {
      t0.emplace(v, Simplex_ptr_set());
      auto v_handle = cleaning_priority.push(std::make_pair(0, v));
      cp_handles.emplace(v, v_handle);
    }
    inserted = t0.at(v).emplace(sptr).second;
    cleaning_priority.update(cp_handles.at(v), std::make_pair(t0.at(v).size() - get_gamma0_lbound(v), v));
  }
  if (inserted) size++;
  if (size > (size_lbound + 1) * BETTA) clean(cleaning_priority.top().second);
  return inserted;
}